

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePooling3dLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int32_t iVar3;
  Pooling3DLayerParams_Pooling3DPaddingType PVar4;
  Pooling3DLayerParams *from;
  allocator<char> local_2c9;
  string local_2c8;
  byte local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  byte local_27a;
  allocator<char> local_279;
  string local_278;
  byte local_252;
  allocator<char> local_251;
  string local_250;
  byte local_22a;
  allocator<char> local_229;
  string local_228;
  byte local_202;
  allocator<char> local_201;
  string local_200;
  byte local_1d9;
  Pooling3DLayerParams_Pooling3DPaddingType local_1d8;
  allocator<char> local_1d1;
  Pooling3DLayerParams_Pooling3DPaddingType paddingType;
  byte local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  byte local_182;
  allocator<char> local_181;
  string local_180;
  byte local_15a;
  allocator<char> local_159;
  string local_158;
  byte local_132;
  allocator<char> local_131;
  string local_130;
  byte local_10a;
  allocator<char> local_109;
  string local_108;
  byte local_e1;
  undefined1 local_e0 [8];
  Pooling3DLayerParams pooling3d;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"Pooling3d",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Pooling3d",
                   (allocator<char> *)
                   ((long)&pooling3d._cached_size_.size_.super___atomic_base<int>._M_i + 3));
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,5,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&pooling3d._cached_size_.size_.super___atomic_base<int>._M_i + 3));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      from = Specification::NeuralNetworkLayer::pooling3d(local_20);
      Specification::Pooling3DLayerParams::Pooling3DLayerParams
                ((Pooling3DLayerParams *)local_e0,from);
      local_e1 = 0;
      iVar3 = Specification::Pooling3DLayerParams::kerneldepth((Pooling3DLayerParams *)local_e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Kernel Depth",&local_109);
      validatePositive(__return_storage_ptr__,iVar3,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      bVar2 = Result::good(__return_storage_ptr__);
      if (!bVar2) {
        local_e1 = 1;
      }
      local_38 = (uint)!bVar2;
      if ((local_e1 & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if (local_38 == 0) {
        local_10a = 0;
        iVar3 = Specification::Pooling3DLayerParams::kernelheight((Pooling3DLayerParams *)local_e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Kernel Height",&local_131);
        validatePositive(__return_storage_ptr__,iVar3,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_10a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_10a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 == 0) {
          local_132 = 0;
          iVar3 = Specification::Pooling3DLayerParams::kernelwidth((Pooling3DLayerParams *)local_e0)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,"Kernel Width",&local_159);
          validatePositive(__return_storage_ptr__,iVar3,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            local_132 = 1;
          }
          local_38 = (uint)!bVar2;
          if ((local_132 & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          if (local_38 == 0) {
            local_15a = 0;
            iVar3 = Specification::Pooling3DLayerParams::stridedepth
                              ((Pooling3DLayerParams *)local_e0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"Stride Depth",&local_181);
            validatePositive(__return_storage_ptr__,iVar3,&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator(&local_181);
            bVar2 = Result::good(__return_storage_ptr__);
            if (!bVar2) {
              local_15a = 1;
            }
            local_38 = (uint)!bVar2;
            if ((local_15a & 1) == 0) {
              Result::~Result(__return_storage_ptr__);
            }
            if (local_38 == 0) {
              local_182 = 0;
              iVar3 = Specification::Pooling3DLayerParams::strideheight
                                ((Pooling3DLayerParams *)local_e0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a8,"Stride Height",&local_1a9);
              validatePositive(__return_storage_ptr__,iVar3,&local_1a8);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::allocator<char>::~allocator(&local_1a9);
              bVar2 = Result::good(__return_storage_ptr__);
              if (!bVar2) {
                local_182 = 1;
              }
              local_38 = (uint)!bVar2;
              if ((local_182 & 1) == 0) {
                Result::~Result(__return_storage_ptr__);
              }
              if (local_38 == 0) {
                local_1aa = 0;
                iVar3 = Specification::Pooling3DLayerParams::stridewidth
                                  ((Pooling3DLayerParams *)local_e0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&paddingType,"Stride Width",&local_1d1);
                validatePositive(__return_storage_ptr__,iVar3,(string *)&paddingType);
                std::__cxx11::string::~string((string *)&paddingType);
                std::allocator<char>::~allocator(&local_1d1);
                bVar2 = Result::good(__return_storage_ptr__);
                if (!bVar2) {
                  local_1aa = 1;
                }
                local_38 = (uint)!bVar2;
                if ((local_1aa & 1) == 0) {
                  Result::~Result(__return_storage_ptr__);
                }
                if (local_38 == 0) {
                  PVar4 = Specification::Pooling3DLayerParams::paddingtype
                                    ((Pooling3DLayerParams *)local_e0);
                  local_1d9 = 0;
                  local_1d8 = PVar4;
                  iVar3 = Specification::Pooling3DLayerParams::custompaddingfront
                                    ((Pooling3DLayerParams *)local_e0);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_200,"Front",&local_201);
                  validatePooling3dPadding(__return_storage_ptr__,PVar4,iVar3,&local_200);
                  std::__cxx11::string::~string((string *)&local_200);
                  std::allocator<char>::~allocator(&local_201);
                  bVar2 = Result::good(__return_storage_ptr__);
                  if (!bVar2) {
                    local_1d9 = 1;
                  }
                  local_38 = (uint)!bVar2;
                  if ((local_1d9 & 1) == 0) {
                    Result::~Result(__return_storage_ptr__);
                  }
                  PVar4 = local_1d8;
                  if (local_38 == 0) {
                    local_202 = 0;
                    iVar3 = Specification::Pooling3DLayerParams::custompaddingback
                                      ((Pooling3DLayerParams *)local_e0);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_228,"Back",&local_229);
                    validatePooling3dPadding(__return_storage_ptr__,PVar4,iVar3,&local_228);
                    std::__cxx11::string::~string((string *)&local_228);
                    std::allocator<char>::~allocator(&local_229);
                    bVar2 = Result::good(__return_storage_ptr__);
                    if (!bVar2) {
                      local_202 = 1;
                    }
                    local_38 = (uint)!bVar2;
                    if ((local_202 & 1) == 0) {
                      Result::~Result(__return_storage_ptr__);
                    }
                    PVar4 = local_1d8;
                    if (local_38 == 0) {
                      local_22a = 0;
                      iVar3 = Specification::Pooling3DLayerParams::custompaddingtop
                                        ((Pooling3DLayerParams *)local_e0);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_250,"Top",&local_251);
                      validatePooling3dPadding(__return_storage_ptr__,PVar4,iVar3,&local_250);
                      std::__cxx11::string::~string((string *)&local_250);
                      std::allocator<char>::~allocator(&local_251);
                      bVar2 = Result::good(__return_storage_ptr__);
                      if (!bVar2) {
                        local_22a = 1;
                      }
                      local_38 = (uint)!bVar2;
                      if ((local_22a & 1) == 0) {
                        Result::~Result(__return_storage_ptr__);
                      }
                      PVar4 = local_1d8;
                      if (local_38 == 0) {
                        local_252 = 0;
                        iVar3 = Specification::Pooling3DLayerParams::custompaddingbottom
                                          ((Pooling3DLayerParams *)local_e0);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_278,"Bottom",&local_279);
                        validatePooling3dPadding(__return_storage_ptr__,PVar4,iVar3,&local_278);
                        std::__cxx11::string::~string((string *)&local_278);
                        std::allocator<char>::~allocator(&local_279);
                        bVar2 = Result::good(__return_storage_ptr__);
                        if (!bVar2) {
                          local_252 = 1;
                        }
                        local_38 = (uint)!bVar2;
                        if ((local_252 & 1) == 0) {
                          Result::~Result(__return_storage_ptr__);
                        }
                        PVar4 = local_1d8;
                        if (local_38 == 0) {
                          local_27a = 0;
                          iVar3 = Specification::Pooling3DLayerParams::custompaddingleft
                                            ((Pooling3DLayerParams *)local_e0);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_2a0,"Left",&local_2a1);
                          validatePooling3dPadding(__return_storage_ptr__,PVar4,iVar3,&local_2a0);
                          std::__cxx11::string::~string((string *)&local_2a0);
                          std::allocator<char>::~allocator(&local_2a1);
                          bVar2 = Result::good(__return_storage_ptr__);
                          if (!bVar2) {
                            local_27a = 1;
                          }
                          local_38 = (uint)!bVar2;
                          if ((local_27a & 1) == 0) {
                            Result::~Result(__return_storage_ptr__);
                          }
                          PVar4 = local_1d8;
                          if (local_38 == 0) {
                            local_2a2 = 0;
                            iVar3 = Specification::Pooling3DLayerParams::custompaddingright
                                              ((Pooling3DLayerParams *)local_e0);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_2c8,"Right",&local_2c9);
                            validatePooling3dPadding(__return_storage_ptr__,PVar4,iVar3,&local_2c8);
                            std::__cxx11::string::~string((string *)&local_2c8);
                            std::allocator<char>::~allocator(&local_2c9);
                            bVar2 = Result::good(__return_storage_ptr__);
                            if (!bVar2) {
                              local_2a2 = 1;
                            }
                            local_38 = (uint)!bVar2;
                            if ((local_2a2 & 1) == 0) {
                              Result::~Result(__return_storage_ptr__);
                            }
                            if (local_38 == 0) {
                              Result::Result(__return_storage_ptr__);
                              local_38 = 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      Specification::Pooling3DLayerParams::~Pooling3DLayerParams((Pooling3DLayerParams *)local_e0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePooling3dLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1))

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Pooling3d", blobNameToRank));

        // Rank 5 for 2 spacial dimensions, 1 temporal dimension, batch dimension, and 1+ channels.
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Pooling3d", 5, -1, blobNameToRank));
    }

    // Kernel
    const auto pooling3d = layer.pooling3d();

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kerneldepth(), "Kernel Depth"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kernelheight(), "Kernel Height"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kernelwidth(), "Kernel Width"));

    // Stride
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.stridedepth(), "Stride Depth"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.strideheight(), "Stride Height"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.stridewidth(), "Stride Width"));

    // Custom Padding
    auto paddingType = pooling3d.paddingtype();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingfront(), "Front"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingback(), "Back"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingtop(), "Top"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingbottom(), "Bottom"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingleft(), "Left"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingright(), "Right"));

    return Result();
}